

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O2

void __thiscall TcpServer::start(TcpServer *this)

{
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *this_00;
  Threadpool *pTVar1;
  _Map_pointer ppfVar2;
  element_type *__p;
  Logger *pLVar3;
  EventLoop *this_01;
  pointer p_Var4;
  size_type sVar5;
  _Ptr pfVar6;
  _Elt_pointer pfVar7;
  runtime_error *this_02;
  anon_class_16_1_8991e283 *__args;
  anon_class_16_1_8991e283 *__args_00;
  long lVar8;
  __allocator_type __a2;
  future<void> res;
  __shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> local_80;
  unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *local_70;
  int *local_68;
  EventLoop *ev;
  undefined1 local_58 [16];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if (this->ts_started == false) {
    Timer::run(&this->ts_timer);
    this->ts_started = true;
    pLVar3 = Logger::get_instance();
    if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x27);
    }
    if (1 < (int)g_log_level) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x27,LOG_LEVEL_INFO,
                        "tcp server create thread pool, thread num is %d\n",this->ts_thread_num);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    local_68 = &this->ts_thread_num;
    std::make_unique<Threadpool,int&>((int *)&res);
    __p = res.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_70 = &this->ts_thread_pool;
    res.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>::reset
              ((__uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_> *)local_70,
               (pointer)__p);
    std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::~unique_ptr
              ((unique_ptr<Threadpool,_std::default_delete<Threadpool>_> *)&res);
    if ((this->ts_thread_pool)._M_t.
        super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>._M_t.
        super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
        super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl == (Threadpool *)0x0) {
      if (-1 < pr_level) {
        printf("[%-5s][%s:%d] tcp_server failed to create thread_pool\n","error","start",0x29);
      }
      exit(1);
    }
    for (lVar8 = 0; lVar8 < *local_68; lVar8 = lVar8 + 1) {
      this_01 = (EventLoop *)operator_new(0x70);
      EventLoop::EventLoop(this_01);
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_01;
      std::vector<EventLoop*,std::allocator<EventLoop*>>::emplace_back<EventLoop*>
                ((vector<EventLoop*,std::allocator<EventLoop*>> *)&this->ts_conn_loops,
                 (EventLoop **)&res);
      ev = (this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar8];
      pLVar3 = Logger::get_instance();
      if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
        printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x30);
      }
      if (1 < (int)g_log_level) {
        pLVar3 = Logger::get_instance();
        Logger::write_log(pLVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                          ,"start",0x30,LOG_LEVEL_INFO,"tcp server add loop_task to thread pool\n");
        pLVar3 = Logger::get_instance();
        Logger::flush(pLVar3);
      }
      pTVar1 = (local_70->_M_t).super___uniq_ptr_impl<Threadpool,_std::default_delete<Threadpool>_>.
               _M_t.super__Tuple_impl<0UL,_Threadpool_*,_std::default_delete<Threadpool>_>.
               super__Head_base<0UL,_Threadpool_*,_false>._M_head_impl;
      if (((pTVar1->tp_run)._M_base._M_i & 1U) == 0) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"post_task on Threadpool has been stopped.");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_58._0_8_ = &ev;
      p_Var4 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate((allocator_type *)&__a2,1);
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0011aa18;
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::__create_task_state<void(),std::_Bind<TcpServer::start()::__0()>,std::allocator<int>>
                ((_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AlberTTreblA[P]HighPerformanceConcurrentServer_net_tcp_server_cpp:49:39)_()>
                  *)&p_Var4->_M_impl,(allocator<int> *)local_58);
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80._M_ptr = (element_type *)&p_Var4->_M_impl;
      local_80._M_refcount._M_pi = &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&res);
      std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&res);
      std::mutex::lock(&pTVar1->tp_lock);
      std::__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2> *)local_58,
                 &local_80);
      pfVar7 = ((iterator *)((long)&(pTVar1->tp_tasks).c + 0x30))->_M_cur;
      if (pfVar7 == *(_Elt_pointer *)((long)&(pTVar1->tp_tasks).c + 0x40) + -1) {
        this_00 = &pTVar1->tp_tasks;
        sVar5 = std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                          (&this_00->c);
        if (sVar5 == 0x7ffffffffffffff) {
          std::__throw_length_error("cannot create std::deque larger than max_size()");
        }
        std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
        _M_reserve_map_at_back(&this_00->c,1);
        pfVar6 = std::_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ::_M_allocate_node((_Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                     *)this_00);
        (*(_Map_pointer *)((long)&(pTVar1->tp_tasks).c + 0x48))[1] = pfVar6;
        std::allocator_traits<std::allocator<std::function<void()>>>::
        construct<std::function<void()>,Threadpool::post_task<TcpServer::start()::__0>(TcpServer::start()::__0&&)::_lambda()_1_>
                  ((allocator_type *)((iterator *)((long)&(pTVar1->tp_tasks).c + 0x30))->_M_cur,
                   (function<void_()> *)local_58,__args_00);
        ppfVar2 = *(_Map_pointer *)((long)&(pTVar1->tp_tasks).c + 0x48);
        *(_Map_pointer *)((long)&(pTVar1->tp_tasks).c + 0x48) = ppfVar2 + 1;
        pfVar7 = ppfVar2[1];
        *(_Elt_pointer *)((long)&(pTVar1->tp_tasks).c + 0x38) = pfVar7;
        *(_Elt_pointer *)((long)&(pTVar1->tp_tasks).c + 0x40) = pfVar7 + 0x10;
      }
      else {
        std::allocator_traits<std::allocator<std::function<void()>>>::
        construct<std::function<void()>,Threadpool::post_task<TcpServer::start()::__0>(TcpServer::start()::__0&&)::_lambda()_1_>
                  ((allocator_type *)pfVar7,(function<void_()> *)local_58,__args);
        pfVar7 = ((iterator *)((long)&(pTVar1->tp_tasks).c + 0x30))->_M_cur + 1;
      }
      ((iterator *)((long)&(pTVar1->tp_tasks).c + 0x30))->_M_cur = pfVar7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
      pthread_mutex_unlock((pthread_mutex_t *)&pTVar1->tp_lock);
      std::condition_variable::notify_one();
      local_48 = res.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      a_Stack_40[0]._M_pi =
           res.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      res.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&res.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    }
  }
  if (((this->ts_acceptor)._M_t.super___uniq_ptr_impl<Acceptor,_std::default_delete<Acceptor>_>._M_t
       .super__Tuple_impl<0UL,_Acceptor_*,_std::default_delete<Acceptor>_>.
       super__Head_base<0UL,_Acceptor_*,_false>._M_head_impl)->ac_listening == false) {
    pLVar3 = Logger::get_instance();
    if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","start",0x37);
    }
    if (1 < (int)g_log_level) {
      pLVar3 = Logger::get_instance();
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/tcp_server.cpp"
                        ,"start",0x37,LOG_LEVEL_INFO,
                        "tcp server add listen task to accpetor eventloop\n");
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    res.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    res.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    EventLoop::add_task(this->ts_acceptor_loop,(Task *)&res);
    std::_Function_base::~_Function_base((_Function_base *)&res);
  }
  return;
}

Assistant:

void TcpServer::start() {
    if (!ts_started)
    {
        ts_timer.run();
        ts_started = true;
LOG_INFO("tcp server create thread pool, thread num is %d\n", ts_thread_num);
        if(ts_thread_pool = make_unique<Threadpool>(ts_thread_num); ts_thread_pool==nullptr) {
            PR_ERROR("tcp_server failed to create thread_pool\n");
            exit(1);
        }
        for(int i=0; i<ts_thread_num; i++)
        {
            ts_conn_loops.emplace_back(new EventLoop());
            EventLoop* ev = ts_conn_loops[i];
LOG_INFO("tcp server add loop_task to thread pool\n");
            ts_thread_pool->post_task([&ev]() { ev->loop(); });
        }
    }

    if (!ts_acceptor->is_listenning())
    {
LOG_INFO("tcp server add listen task to accpetor eventloop\n");
        ts_acceptor_loop->add_task([this](){ this->ts_acceptor->listen(); });
    }
}